

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IterNextFrom(Fts5IndexIter *pIndexIter,i64 iMatch)

{
  int iVar1;
  Fts5Index *p;
  
  p = (Fts5Index *)pIndexIter[1].iRowid;
  while( true ) {
    fts5MultiIterNext(p,(Fts5Iter *)pIndexIter,1,iMatch);
    if ((p->rc != 0) || (pIndexIter->bEof != '\0')) break;
    if (((*(int *)&pIndexIter[2].bEof == 0) &&
        (iMatch <= (long)pIndexIter[(ulong)*(ushort *)(*(long *)&pIndexIter[3].nData + 4) * 5 + 8].
                         pData)) ||
       ((*(int *)&pIndexIter[2].bEof != 0 &&
        ((long)pIndexIter[(ulong)*(ushort *)(*(long *)&pIndexIter[3].nData + 4) * 5 + 8].pData <=
         iMatch)))) break;
  }
  iVar1 = *(int *)(pIndexIter[1].iRowid + 0x34);
  *(undefined4 *)(pIndexIter[1].iRowid + 0x34) = 0;
  return iVar1;
}

Assistant:

static int sqlite3Fts5IterNextFrom(Fts5IndexIter *pIndexIter, i64 iMatch){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  fts5MultiIterNextFrom(pIter->pIndex, pIter, iMatch);
  return fts5IndexReturn(pIter->pIndex);
}